

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O1

void __thiscall libtorrent::dht::find_data::done(find_data *this)

{
  uint uVar1;
  dht_observer *pdVar2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  int iVar6;
  iterator iVar7;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  int iVar8;
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  results;
  undefined1 local_b8 [68];
  endpoint local_74;
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Base_ptr local_40;
  map<libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  this->m_done = true;
  pdVar2 = ((this->super_traversal_algorithm).m_node)->m_observer;
  if (pdVar2 != (dht_observer *)0x0) {
    uVar1 = (this->super_traversal_algorithm).m_id;
    (*(this->super_traversal_algorithm)._vptr_traversal_algorithm[2])(this);
    (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])(pdVar2,4,"[%u] %s DONE",(ulong)uVar1);
  }
  local_58.
  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = (this->super_traversal_algorithm).m_results.
           super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = (((this->super_traversal_algorithm).m_node)->m_table).m_bucket_size;
  psVar4 = (this->super_traversal_algorithm).m_results.
           super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < iVar8 && psVar3 != psVar4) {
    local_38 = &this->m_write_tokens;
    local_40 = &(this->m_write_tokens)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      peVar5 = (psVar3->super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (((peVar5->flags).m_val & 0x40) == 0) {
        if ((pdVar2 != (dht_observer *)0x0) &&
           (iVar6 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4), (char)iVar6 != '\0'))
        {
          uVar1 = (this->super_traversal_algorithm).m_id;
          observer::target_ep(&local_74,
                              (psVar3->
                              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
          aux::print_endpoint_abi_cxx11_((string *)local_b8,(aux *)&local_74,ep);
          (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar2,4,"[%u] not alive: %s",(ulong)uVar1);
LAB_003c095f:
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
          }
        }
      }
      else {
        iVar7 = ::std::
                _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_38->_M_t,&peVar5->m_id);
        if (iVar7._M_node == local_40) {
          if ((pdVar2 != (dht_observer *)0x0) &&
             (iVar6 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4), (char)iVar6 != '\0'
             )) {
            uVar1 = (this->super_traversal_algorithm).m_id;
            observer::target_ep(&local_74,
                                (psVar3->
                                super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
            aux::print_endpoint_abi_cxx11_((string *)local_b8,(aux *)&local_74,ep_01);
            (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                      (pdVar2,4,"[%u] no write token: %s",(ulong)uVar1);
            goto LAB_003c095f;
          }
        }
        else {
          peVar5 = (psVar3->
                   super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          observer::target_ep(&local_74,
                              (psVar3->
                              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
          node_entry::node_entry((node_entry *)local_b8,&peVar5->m_id,&local_74,0xffff,false);
          ::std::
          vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>
          ::emplace_back<libtorrent::dht::node_entry,std::__cxx11::string&>
                    ((vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>
                      *)&local_58,(node_entry *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &iVar7._M_node[1]._M_right);
          if ((pdVar2 != (dht_observer *)0x0) &&
             (iVar6 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4), (char)iVar6 != '\0'
             )) {
            uVar1 = (this->super_traversal_algorithm).m_id;
            observer::target_ep(&local_74,
                                (psVar3->
                                super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
            aux::print_endpoint_abi_cxx11_((string *)local_b8,(aux *)&local_74,ep_00);
            (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])(pdVar2,4,"[%u] %s",(ulong)uVar1);
            if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
              operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
            }
          }
          iVar8 = iVar8 + -1;
        }
      }
    } while ((psVar3 + 1 != psVar4) && (psVar3 = psVar3 + 1, 0 < iVar8));
  }
  if ((this->m_nodes_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_nodes_callback)._M_invoker)((_Any_data *)&this->m_nodes_callback,&local_58);
  }
  traversal_algorithm::done(&this->super_traversal_algorithm);
  ::std::
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void find_data::done()
{
	m_done = true;

#ifndef TORRENT_DISABLE_LOGGING
	auto* logger = get_node().observer();
	if (logger != nullptr)
	{
		logger->log(dht_logger::traversal, "[%u] %s DONE"
			, id(), name());
	}
#endif

	std::vector<std::pair<node_entry, std::string>> results;
	int num_results = m_node.m_table.bucket_size();
	for (auto i = m_results.begin()
		, end(m_results.end()); i != end && num_results > 0; ++i)
	{
		observer_ptr const& o = *i;
		if (!(o->flags & observer::flag_alive))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal, "[%u] not alive: %s"
					, id(), aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			continue;
		}
		auto j = m_write_tokens.find(o->id());
		if (j == m_write_tokens.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal, "[%u] no write token: %s"
					, id(), aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			continue;
		}
		results.emplace_back(node_entry(o->id(), o->target_ep()), j->second);
#ifndef TORRENT_DISABLE_LOGGING
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal, "[%u] %s"
				, id(), aux::print_endpoint(o->target_ep()).c_str());
		}
#endif
		--num_results;
	}

	if (m_nodes_callback) m_nodes_callback(results);

	traversal_algorithm::done();
}